

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O0

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::convert(ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *this,bool aValue,uint8_t param_3,uint8_t param_4)

{
  byte in_SIL;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  *in_RDI;
  char *local_20;
  
  if ((in_SIL & 1) == 0) {
    local_20 = "false";
  }
  else {
    local_20 = "true";
  }
  append(in_RDI,local_20);
  appendSpace((ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
               *)0x10a9d5);
  return;
}

Assistant:

void convert(bool const aValue, uint8_t const, uint8_t const) noexcept {
    append(aValue ? csTrue : csFalse);
    appendSpace();
  }